

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O0

Diagnostic * __thiscall slang::Diagnostic::operator=(Diagnostic *this,Diagnostic *param_2)

{
  long in_RSI;
  Diagnostic *in_RDI;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *in_stack_00000088;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *in_stack_00000090;
  
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::operator=((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               *)in_stack_00000090,
              (vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               *)in_stack_00000088);
  std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::operator=
            ((vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)in_stack_00000090,
             (vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)in_stack_00000088);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::operator=
            (in_stack_00000090,in_stack_00000088);
  memcpy(&in_RDI->coalesceCount,(void *)(in_RSI + 0x48),0x28);
  return in_RDI;
}

Assistant:

class SLANG_EXPORT Diagnostic {
public:
    using CustomArgType = std::pair<SLANG_TYPEINDEX, std::any>;

    // Diagnostic-specific arguments that can be used to better report messages.
    using Arg = std::variant<std::string, int64_t, uint64_t, char, ConstantValue, CustomArgType>;
    std::vector<Arg> args;
    std::vector<SourceRange> ranges;
    std::vector<Diagnostic> notes;
    std::optional<size_t> coalesceCount;

    /// The specific kind of diagnostic that was issued.
    DiagCode code;

    /// The location in source of the cause of the diagnostic.
    SourceLocation location;

    /// The symbol in which the diagnostic occurred, or null if not applicable.
    const ast::Symbol* symbol = nullptr;

    /// Default constructs a new Diagnostic entry.
    Diagnostic() noexcept;

    /// Constructs a new Diagnostic entry with the given code and location.
    Diagnostic(DiagCode code, SourceLocation location) noexcept;

    /// Constructs a new Diagnostic entry with the given symbol, code and location.
    Diagnostic(const ast::Symbol& source, DiagCode code, SourceLocation location) noexcept;

    /// Returns true if this diagnostic's code is intrinsically considered an error,
    /// regardless of what severity mapping rules might be in place.
    bool isError() const;

    /// Adds a new note to the diagnostic at the given source location.
    Diagnostic& addNote(DiagCode code, SourceLocation location);
    Diagnostic& addNote(DiagCode code, SourceRange range);
    Diagnostic& addNote(const Diagnostic& diag);

    /// Adds an argument to the diagnostic.
    Diagnostic& operator<<(const std::string& arg);
    Diagnostic& operator<<(std::string_view arg);
    Diagnostic& operator<<(SourceRange arg);
    Diagnostic& operator<<(const ConstantValue& arg);
    Diagnostic& operator<<(char arg);
    Diagnostic& operator<<(real_t arg);
    Diagnostic& operator<<(shortreal_t arg);

    Diagnostic& addStringAllowEmpty(const std::string& arg);

    template<std::signed_integral T>
    Diagnostic& operator<<(T arg) {
        args.emplace_back((int64_t)arg);
        return *this;
    }

    template<std::unsigned_integral T>
    Diagnostic& operator<<(T arg) {
        args.emplace_back((uint64_t)arg);
        return *this;
    }

    bool operator==(const Diagnostic& rhs) const;
}